

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

basic_appender<char>
fmt::v11::detail::write_codepoint<2ul,char,fmt::v11::basic_appender<char>>
          (basic_appender<char> out,char prefix,uint32_t cp)

{
  bool bVar1;
  char *pcVar2;
  char buf [2];
  char acStack_26 [6];
  
  _buf = out.container;
  basic_appender<char>::operator=((basic_appender<char> *)buf,'\\');
  _buf = out.container;
  basic_appender<char>::operator=((basic_appender<char> *)buf,prefix);
  buf[0] = '0';
  buf[1] = '0';
  pcVar2 = buf + 1;
  do {
    *pcVar2 = "0123456789abcdef"[cp & 0xf];
    pcVar2 = pcVar2 + -1;
    bVar1 = 0xf < cp;
    cp = cp >> 4;
  } while (bVar1);
  buffer<char>::append<char>(out.container,buf,acStack_26);
  return (basic_appender<char>)out.container;
}

Assistant:

auto write_codepoint(OutputIt out, char prefix, uint32_t cp) -> OutputIt {
  *out++ = static_cast<Char>('\\');
  *out++ = static_cast<Char>(prefix);
  Char buf[width];
  fill_n(buf, width, static_cast<Char>('0'));
  format_base2e(4, buf, cp, width);
  return copy<Char>(buf, buf + width, out);
}